

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLeSample> * __thiscall
pbrt::SpotLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,SpotLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  float fVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  bool bVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar39 [12];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  undefined8 in_XMM0_Qb;
  undefined1 extraout_var [60];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  float fVar27;
  undefined1 in_register_00001248 [56];
  undefined1 auVar28 [64];
  undefined1 auVar30 [56];
  undefined1 auVar31 [16];
  float n2;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar37 [64];
  Vector3f wl;
  SampledSpectrum SVar38;
  Float p [2];
  Ray ray;
  undefined1 local_b8 [16];
  float local_a4 [2];
  Float local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Ray local_70;
  Ray local_48;
  undefined1 extraout_var_00 [60];
  undefined1 auVar26 [56];
  undefined1 auVar29 [64];
  
  auVar28._8_56_ = in_register_00001248;
  auVar28._0_8_ = u2.super_Tuple2<pbrt::Point2,_float>;
  local_b8._8_8_ = in_XMM0_Qb;
  local_b8._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  auVar21 = local_b8;
  local_a4[0] = 1.0 - this->cosFalloffStart;
  local_a4[1] = (this->cosFalloffStart - this->cosFalloffEnd) * 0.5;
  fVar27 = 0.0;
  lVar10 = 0;
  do {
    fVar27 = fVar27 + *(float *)((long)local_a4 + lVar10);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 8);
  lVar10 = 0;
  do {
    if (auVar28._0_4_ < local_a4[lVar10] / fVar27) goto LAB_0035d51e;
    auVar28 = ZEXT464((uint)(auVar28._0_4_ - local_a4[lVar10] / fVar27));
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  lVar10 = 2;
LAB_0035d51e:
  local_9c = time;
  if ((SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') &&
     (iVar9 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg)
     , iVar9 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg,
               SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
               {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
    __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
  }
  *(long *)(in_FS_OFFSET + -0x330) = *(long *)(in_FS_OFFSET + -0x330) + 1;
  if (lVar10 == 2) {
    *(long *)(in_FS_OFFSET + -0x338) = *(long *)(in_FS_OFFSET + -0x338) + 1;
    lVar10 = 1;
  }
  fVar1 = local_a4[(int)lVar10];
  local_b8._0_4_ = u1.super_Tuple2<pbrt::Point2,_float>.x;
  if ((int)lVar10 == 0) {
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(1.0 - (float)local_b8._0_4_)),auVar21,
                              ZEXT416((uint)this->cosFalloffStart));
    local_88._0_4_ = auVar14._0_4_;
    auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_88._0_4_ * (float)local_88._0_4_)),
                         ZEXT816(0));
    if (auVar14._0_4_ < 0.0) {
      auVar37._0_4_ = sqrtf(auVar14._0_4_);
      auVar37._4_60_ = extraout_var;
      auVar14 = auVar37._0_16_;
    }
    else {
      auVar14 = vsqrtss_avx(auVar14,auVar14);
    }
    auVar21 = vmovshdup_avx(auVar21);
    fVar22 = (auVar21._0_4_ + auVar21._0_4_) * 3.1415927;
    auVar21 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
    uVar5 = vcmpss_avx512f(auVar14,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar12 = (bool)((byte)uVar5 & 1);
    fVar13 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * auVar21._0_4_);
    fVar23 = cosf(fVar22);
    local_98 = ZEXT416((uint)(fVar23 * fVar13));
    fVar22 = sinf(fVar22);
    auVar21 = vinsertps_avx(local_98,ZEXT416((uint)(fVar22 * fVar13)),0x10);
    auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_88._0_4_));
    uVar5 = vcmpss_avx512f(ZEXT416((uint)local_88._0_4_),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar12 = (bool)((byte)uVar5 & 1);
    auVar14._0_4_ = (uint)bVar12 * -0x40800000 + (uint)!bVar12 * auVar14._0_4_;
    fVar27 = (1.0 / ((1.0 - this->cosFalloffStart) * 6.2831855)) * (fVar1 / fVar27);
  }
  else {
    fVar22 = this->cosFalloffStart;
    fVar13 = this->cosFalloffEnd;
    auVar28 = ZEXT464((uint)fVar13);
    fVar34 = fVar22 - fVar13;
    fVar32 = (fVar13 - fVar13) / fVar34;
    fVar23 = fVar32 * fVar32;
    auVar14 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar23 * fVar23)),ZEXT416(0x40000000),
                                  ZEXT416((uint)(fVar32 * fVar23)));
    fVar23 = auVar14._0_4_ - (float)local_b8._0_4_;
    auVar15._8_4_ = 0x7fffffff;
    auVar15._0_8_ = 0x7fffffff7fffffff;
    auVar15._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(ZEXT416((uint)fVar23),auVar15);
    auVar19 = ZEXT416((uint)fVar13);
    local_88 = auVar19;
    if (1e-06 <= auVar14._0_4_) {
      fVar33 = fVar34 / fVar34;
      fVar32 = fVar33 * fVar33;
      auVar14 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar32 * fVar32)),ZEXT416(0x40000000),
                                    ZEXT416((uint)(fVar33 * fVar32)));
      fVar32 = auVar14._0_4_ - (float)local_b8._0_4_;
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar14 = vandps_avx512vl(ZEXT416((uint)fVar32),auVar35);
      fVar33 = auVar14._0_4_;
      bVar12 = fVar33 == 1e-06;
      bVar11 = 1e-06 < fVar33;
      auVar14 = ZEXT416((uint)fVar22);
      local_88 = auVar14;
      if (1e-06 <= fVar33) {
        auVar37 = ZEXT464((uint)(fVar13 - (fVar34 * fVar23) / (fVar32 - fVar23)));
        auVar15 = vdivss_avx512f(ZEXT416(0x40000000),ZEXT416((uint)fVar34));
        auVar35 = ZEXT816(0) << 0x20;
        uVar5 = vcmpps_avx512vl(ZEXT416((uint)fVar23),auVar35,1);
        auVar36._8_4_ = 0x7fffffff;
        auVar36._0_8_ = 0x7fffffff7fffffff;
        auVar36._12_4_ = 0x7fffffff;
        auVar17 = auVar14;
        do {
          fVar23 = auVar17._0_4_;
          auVar16 = vmulss_avx512f(ZEXT416((uint)(fVar23 + auVar19._0_4_)),
                                   SUB6416(ZEXT464(0x3f000000),0));
          uVar4 = vcmpss_avx512f(auVar37._0_16_,auVar17,1);
          bVar8 = (bool)((byte)uVar4 & 1);
          uVar4 = vcmpss_avx512f(auVar19,auVar37._0_16_,1);
          bVar6 = (bool)((byte)uVar4 & 1);
          auVar16._0_4_ =
               (uint)bVar6 * ((uint)bVar8 * auVar37._0_4_ + (uint)!bVar8 * auVar16._0_4_) +
               (uint)!bVar6 * auVar16._0_4_;
          auVar17 = vsubss_avx512f(auVar16,auVar28._0_16_);
          auVar20._0_4_ = auVar17._0_4_ / fVar34;
          auVar20._4_12_ = auVar17._4_12_;
          auVar17 = vucomiss_avx512f(auVar16);
          auVar28 = ZEXT1664(auVar17);
          fVar13 = 0.0;
          if ((bVar11 || bVar12) && (auVar16 = vucomiss_avx512f(auVar14), bVar11 || bVar12)) {
            if ((auVar17._0_4_ != fVar22) || (NAN(auVar17._0_4_) || NAN(fVar22))) {
              auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar20);
              uVar4 = vcmpss_avx512f(auVar20,auVar35,1);
              fVar13 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar17._0_4_);
              auVar18._4_12_ = auVar17._4_12_;
              auVar18._0_4_ = fVar13;
              auVar17 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc0000000),0),auVar18,
                                            SUB6416(ZEXT464(0x40400000),0));
              auVar17 = vmulss_avx512f(ZEXT416((uint)(fVar13 * fVar13)),auVar17);
              fVar13 = auVar17._0_4_;
            }
            else {
              uVar4 = vcmpss_avx512f(auVar16,auVar17,5);
              fVar13 = (float)((uint)((byte)uVar4 & 1) * 0x3f800000);
            }
            fVar13 = fVar13 * auVar15._0_4_;
          }
          fVar32 = auVar20._0_4_ * auVar20._0_4_;
          auVar17 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar32 * fVar32)),
                                        ZEXT416((uint)(auVar20._0_4_ * fVar32)),ZEXT416(0x40000000))
          ;
          fVar32 = auVar17._0_4_ - (float)local_b8._0_4_;
          uVar4 = vcmpps_avx512vl(ZEXT416((uint)fVar32),auVar35,5);
          bVar7 = (byte)uVar5 ^ (byte)uVar4;
          iVar9 = auVar16._0_4_;
          register0x00000900 = auVar16._4_12_;
          auVar17._0_4_ =
               (float)((uint)(bVar7 & 1) * (int)fVar23 + (uint)!(bool)(bVar7 & 1) * iVar9);
          auVar19._0_4_ =
               (float)((uint)(bVar7 & 1) * iVar9 + (uint)!(bool)(bVar7 & 1) * (int)auVar19._0_4_);
          auVar20 = vandps_avx512vl(ZEXT416((uint)fVar32),auVar36);
          uVar4 = vcmpps_avx512vl(auVar20,SUB6416(ZEXT464(0x358637bd),0),5);
          uVar3 = vcmpps_avx512vl(ZEXT416((uint)(auVar17._0_4_ - auVar19._0_4_)),
                                  SUB6416(ZEXT464(0x358637bd),0),5);
          bVar11 = false;
          bVar8 = (bool)((byte)uVar4 & (byte)uVar3 & 1);
          bVar12 = bVar8 == false;
          auVar16 = vsubss_avx512f(auVar16,ZEXT416((uint)(fVar32 / fVar13)));
          auVar16 = CONCAT124(register0x00000900,(uint)bVar8 * auVar16._0_4_ + (uint)!bVar8 * iVar9)
          ;
          auVar37 = ZEXT1664(auVar16);
          local_88._0_4_ = (uint)bVar8 * in_ZMM11._0_4_ + (uint)!bVar8 * iVar9;
          local_88._4_12_ = register0x00000900;
          in_ZMM11 = ZEXT1664(local_88);
        } while (!bVar12);
      }
    }
    auVar14 = vfnmadd231ss_avx512f(SUB6416(ZEXT464(0x3f800000),0),local_88,local_88);
    auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x40);
    if (auVar14._0_4_ < 0.0) {
      auVar24._0_4_ = sqrtf(auVar14._0_4_);
      auVar24._4_60_ = extraout_var_00;
      auVar14 = auVar24._0_16_;
    }
    else {
      auVar14 = vsqrtss_avx(auVar14,auVar14);
    }
    auVar21 = vmovshdup_avx(auVar21);
    fVar22 = (auVar21._0_4_ + auVar21._0_4_) * 3.1415927;
    auVar21 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
    uVar5 = vcmpss_avx512f(auVar14,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar12 = (bool)((byte)uVar5 & 1);
    fVar13 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * auVar21._0_4_);
    fVar23 = cosf(fVar22);
    local_98 = ZEXT416((uint)(fVar23 * fVar13));
    fVar23 = sinf(fVar22);
    auVar21 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),local_88);
    uVar5 = vcmpss_avx512f(local_88,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar12 = (bool)((byte)uVar5 & 1);
    auVar14._4_12_ = auVar21._4_12_;
    auVar14._0_4_ = (uint)bVar12 * -0x40800000 + (uint)!bVar12 * auVar21._0_4_;
    fVar22 = this->cosFalloffEnd;
    fVar34 = local_88._0_4_;
    if (fVar34 < fVar22) {
      fVar32 = 0.0;
    }
    else {
      fVar33 = this->cosFalloffStart;
      fVar32 = 0.0;
      if (fVar34 <= fVar33) {
        if ((fVar22 != fVar33) || (NAN(fVar22) || NAN(fVar33))) {
          auVar31._0_4_ = (fVar34 - fVar22) / (fVar33 - fVar22);
          auVar31._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar21 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar31);
          uVar5 = vcmpss_avx512f(auVar31,ZEXT816(0),1);
          fVar34 = (float)((uint)!(bool)((byte)uVar5 & 1) * auVar21._0_4_);
          auVar21._0_4_ = fVar34;
          auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar21,ZEXT416(0x40400000));
          fVar32 = fVar34 * fVar34 * auVar21._0_4_;
        }
        else {
          uVar5 = vcmpss_avx512f(local_88,ZEXT416((uint)fVar22),5);
          fVar32 = (float)((uint)((byte)uVar5 & 1) * 0x3f800000);
        }
        fVar32 = (2.0 / (fVar33 - fVar22)) * fVar32;
      }
    }
    auVar21 = vinsertps_avx(local_98,ZEXT416((uint)(fVar23 * fVar13)),0x10);
    fVar27 = (fVar32 * (fVar1 / fVar27)) / 6.2831855;
  }
  local_70.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_LightBase).mediumInterface.outside.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_70.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar21);
  auVar28 = ZEXT464((uint)local_9c);
  local_70.time = local_9c;
  local_70.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar14._0_4_;
  Transform::operator()(&local_48,&(this->super_LightBase).renderFromLight,&local_70,(Float *)0x0);
  local_b8._8_8_ = auVar14._8_8_;
  wl.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar28._0_8_;
  wl.super_Tuple3<pbrt::Vector3,_float>.z = auVar14._0_4_;
  auVar30 = ZEXT856((ulong)local_b8._8_8_);
  auVar26 = auVar28._8_56_;
  SVar38 = I(this,wl,lambda);
  auVar29._0_8_ = SVar38.values.values._8_8_;
  auVar29._8_56_ = auVar30;
  auVar25._0_8_ = SVar38.values.values._0_8_;
  auVar25._8_56_ = auVar26;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
       local_48.o.super_Tuple3<pbrt::Point3,_float>._0_8_;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       CONCAT44(local_48.d.super_Tuple3<pbrt::Vector3,_float>.x,
                local_48.o.super_Tuple3<pbrt::Point3,_float>.z);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
       CONCAT44(local_48.d.super_Tuple3<pbrt::Vector3,_float>.y,
                local_48.d.super_Tuple3<pbrt::Vector3,_float>.x);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = local_48._20_8_;
  __return_storage_ptr__->set = true;
  aVar2 = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar25._0_16_);
  (__return_storage_ptr__->optionalValue).__align = aVar2;
  uVar5 = vmovlps_avx(auVar29._0_16_);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uVar5;
  ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    *)((long)&__return_storage_ptr__->optionalValue + 0x30))->bits =
       (uintptr_t)
       local_48.medium.
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       .bits;
  (__return_storage_ptr__->optionalValue).__data[0x88] = '\0';
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0x3f800000;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x94) = fVar27;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> SpotLight::SampleLe(Point2f u1, Point2f u2,
                                                  SampledWavelengths &lambda,
                                                  Float time) const {
    // Choose whether to sample spotlight center cone or falloff region
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};
    Float sectionPDF;
    int section = SampleDiscrete(p, u2[0], &sectionPDF);

    Vector3f wl;
    Float pdfDir;
    if (section == 0) {
        // Sample spotlight center cone
        wl = SampleUniformCone(u1, cosFalloffStart);
        pdfDir = UniformConePDF(cosFalloffStart) * sectionPDF;

    } else {
        // Sample spotlight falloff region
        Float cosTheta = SampleSmoothStep(u1[0], cosFalloffEnd, cosFalloffStart);
        DCHECK(cosTheta >= cosFalloffEnd && cosTheta <= cosFalloffStart);
        Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
        Float phi = u1[1] * 2 * Pi;
        wl = SphericalDirection(sinTheta, cosTheta, phi);
        pdfDir = SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) * sectionPDF /
                 (2 * Pi);
    }
    // Return sampled spotlight ray
    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.outside));
    return LightLeSample(I(wl, lambda), ray, 1, pdfDir);
}